

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

void __thiscall QPixmap::QPixmap(QPixmap *this,QPixmap *pixmap)

{
  QAtomicInt *pQVar1;
  totally_ordered_wrapper<QPlatformPixmap_*> tVar2;
  QPlatformPixmap *pQVar3;
  bool bVar4;
  QExplicitlySharedDataPointer<QPlatformPixmap> *this_00;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  QPixmap local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007e3618;
  (this->data).d.ptr = (QPlatformPixmap *)0x0;
  this_00 = &this->data;
  bVar4 = qt_pixmap_thread_test();
  if (bVar4) {
    if ((pixmap->super_QPaintDevice).painters == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QExplicitlySharedDataPointer<QPlatformPixmap>::operator=(this_00,&pixmap->data);
        return;
      }
      goto LAB_002b09ad;
    }
    local_48 = 0;
    uStack_40 = 0xffffffffffffffff;
    copy(&local_38,(EVP_PKEY_CTX *)pixmap,(EVP_PKEY_CTX *)&local_48);
    tVar2.ptr = (this_00->d).ptr;
    (this_00->d).ptr = (QPlatformPixmap *)local_38.data.d.ptr;
    local_38.data.d.ptr =
         (totally_ordered_wrapper<QPlatformPixmap_*>)
         (totally_ordered_wrapper<QPlatformPixmap_*>)tVar2.ptr;
    ~QPixmap(&local_38);
  }
  else {
    pQVar3 = (this_00->d).ptr;
    if (pQVar3 != (QPlatformPixmap *)0x0) {
      (this_00->d).ptr = (QPlatformPixmap *)0x0;
      LOCK();
      pQVar1 = &pQVar3->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          (*pQVar3->_vptr_QPlatformPixmap[1])();
          return;
        }
        goto LAB_002b09ad;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_002b09ad:
  __stack_chk_fail();
}

Assistant:

QPixmap::QPixmap(const QPixmap &pixmap)
    : QPaintDevice()
{
    if (!qt_pixmap_thread_test()) {
        doInit(0, 0, QPlatformPixmap::PixmapType);
        return;
    }
    if (pixmap.paintingActive()) {                // make a deep copy
        pixmap.copy().swap(*this);
    } else {
        data = pixmap.data;
    }
}